

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_node_comment
               (fy_emitter *emit,fy_node *fyn,int flags,int indent,fy_comment_placement placement)

{
  _Bool _Var1;
  fy_token *fyt_00;
  fy_token *fyt;
  fy_comment_placement placement_local;
  int indent_local;
  int flags_local;
  fy_node *fyn_local;
  fy_emitter *emit_local;
  
  _Var1 = fy_emit_output_comments(emit);
  if (((_Var1) && (placement < fycp_max)) &&
     (fyt_00 = fy_node_value_token(fyn), fyt_00 != (fy_token *)0x0)) {
    fy_emit_token_comment(emit,fyt_00,flags,indent,placement);
  }
  return;
}

Assistant:

void fy_emit_node_comment(struct fy_emitter *emit, struct fy_node *fyn, int flags, int indent,
                          enum fy_comment_placement placement) {
    struct fy_token *fyt;

    if (!fy_emit_output_comments(emit) || (unsigned int) placement >= fycp_max)
        return;

    fyt = fy_node_value_token(fyn);
    if (!fyt)
        return;

    fy_emit_token_comment(emit, fyt, flags, indent, placement);
}